

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_data.cpp
# Opt level: O3

void __thiscall duckdb::ErrorData::AddErrorLocation(ErrorData *this,string *query)

{
  char **ppcVar1;
  pointer pcVar2;
  int iVar3;
  char **__nptr;
  iterator iVar4;
  int *piVar5;
  ulonglong index;
  undefined8 uVar6;
  undefined1 local_58 [32];
  optional_idx local_38;
  
  if (query->_M_string_length != 0) {
    ppcVar1 = (char **)(local_58 + 0x10);
    local_58._0_8_ = ppcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"position","");
    iVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&this->extra_info,(key_type *)local_58);
    if ((char **)local_58._0_8_ != ppcVar1) {
      operator_delete((void *)local_58._0_8_);
    }
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      __nptr = *(char ***)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur + 0x28);
      piVar5 = __errno_location();
      iVar3 = *piVar5;
      *piVar5 = 0;
      index = strtoull((char *)__nptr,(char **)local_58,10);
      if ((char **)local_58._0_8_ == __nptr) {
        uVar6 = ::std::__throw_invalid_argument("stoull");
        if ((undefined1 *)local_58._0_8_ != local_58) {
          operator_delete((void *)local_58._0_8_);
        }
        _Unwind_Resume(uVar6);
      }
      if (*piVar5 == 0) {
        *piVar5 = iVar3;
      }
      else if (*piVar5 == 0x22) {
        ::std::__throw_out_of_range("stoull");
      }
      optional_idx::optional_idx(&local_38,index);
      QueryErrorContext::Format((string *)local_58,query,&this->raw_message,local_38,true);
      ::std::__cxx11::string::operator=((string *)&this->raw_message,(string *)local_58);
      if ((char **)local_58._0_8_ != ppcVar1) {
        operator_delete((void *)local_58._0_8_);
      }
    }
  }
  pcVar2 = local_58 + 0x10;
  local_58._0_8_ = pcVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"stack_trace","");
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&this->extra_info,(key_type *)local_58);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_);
  }
  if ((iVar4.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
       ._M_cur != (__node_type *)0x0) &&
     (*(long *)((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur + 0x30) != 0)) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "\n\nStack Trace:\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)iVar4.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur + 0x28));
    ::std::__cxx11::string::_M_append((char *)&this->raw_message,local_58._0_8_);
    if ((pointer)local_58._0_8_ != pcVar2) {
      operator_delete((void *)local_58._0_8_);
    }
    ::std::__cxx11::string::_M_replace
              ((ulong)((long)iVar4.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 0x28),0,
               *(char **)((long)iVar4.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                ._M_cur + 0x30),0x1f53803);
  }
  ConstructFinalMessage_abi_cxx11_((string *)local_58,this);
  ::std::__cxx11::string::operator=((string *)&this->final_message,(string *)local_58);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_);
  }
  return;
}

Assistant:

void ErrorData::AddErrorLocation(const string &query) {
	if (!query.empty()) {
		auto entry = extra_info.find("position");
		if (entry != extra_info.end()) {
			raw_message = QueryErrorContext::Format(query, raw_message, std::stoull(entry->second));
		}
	}
	{
		auto entry = extra_info.find("stack_trace");
		if (entry != extra_info.end() && !entry->second.empty()) {
			raw_message += "\n\nStack Trace:\n" + entry->second;
			entry->second = "";
		}
	}
	final_message = ConstructFinalMessage();
}